

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerIteration.cpp
# Opt level: O2

EigenAnswer * RealValues(EigenAnswer *__return_storage_ptr__,Vector *x1,Vector *x2)

{
  double dVar1;
  pointer pdVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  pdVar2 = (x2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  dVar5 = 0.0;
  for (lVar3 = 0;
      (long)(x2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar2 >> 3 != lVar3; lVar3 = lVar3 + 1) {
    dVar1 = (x1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar3];
    if (((dVar1 != 0.0) || (dVar4 = dVar5, NAN(dVar1))) &&
       (dVar4 = pdVar2[lVar3] / dVar1, dVar4 <= dVar5)) {
      dVar4 = dVar5;
    }
    dVar5 = dVar4;
  }
  std::vector<double,_std::allocator<double>_>::vector(&__return_storage_ptr__->vector,x2);
  __return_storage_ptr__->value = dVar5;
  return __return_storage_ptr__;
}

Assistant:

EigenAnswer RealValues(const Vector &x1, const Vector &x2)
{
    const Vector &ans = x2;
    double value = 0;

    // average?
    for (int i = 0; i < ans.size(); ++i)
    {
        if (x1[i] != 0)
        {
            value = std::max(value, x2[i] / x1[i]);
        }
    }

    return {.vector = ans, .value = value};
}